

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O0

void brotli::HistogramRemap<brotli::Histogram<704>>
               (Histogram<704> *in,size_t in_size,Histogram<704> *out,uint32_t *symbols)

{
  bool bVar1;
  iterator __first;
  size_type __new_size;
  reference puVar2;
  uint local_11c;
  ulong local_e0;
  size_t i_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_d0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  const_iterator k_1;
  double cur_bits;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a8;
  const_iterator k;
  double best_bits;
  ulong uStack_90;
  uint32_t best_out;
  size_t i;
  uint *local_80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  iterator last;
  allocator<unsigned_int> local_41;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> all_symbols;
  uint32_t *symbols_local;
  Histogram<704> *out_local;
  size_t in_size_local;
  Histogram<704> *in_local;
  
  all_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = symbols;
  std::allocator<unsigned_int>::allocator(&local_41);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_40,symbols,symbols + in_size
             ,&local_41);
  std::allocator<unsigned_int>::~allocator(&local_41);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )last._M_current);
  local_78._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  local_80 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  local_70 = std::
             unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (local_78,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_80);
  i = (size_t)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  __new_size = __gnu_cxx::operator-
                         (&local_70,
                          (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           *)&i);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,__new_size);
  for (uStack_90 = 0; uStack_90 < in_size; uStack_90 = uStack_90 + 1) {
    if (uStack_90 == 0) {
      local_11c = *all_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_11c = all_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage[uStack_90 - 1];
    }
    best_bits._4_4_ = local_11c;
    k._M_current = (uint *)HistogramBitCostDistance<brotli::Histogram<704>>
                                     (in + uStack_90,out + local_11c);
    local_b0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_a8,&local_b0);
    while( true ) {
      cur_bits = (double)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_a8,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&cur_bits);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_a8);
      k_1._M_current =
           (uint *)HistogramBitCostDistance<brotli::Histogram<704>>(in + uStack_90,out + *puVar2);
      if ((double)k_1._M_current < (double)k._M_current) {
        k._M_current = k_1._M_current;
        puVar2 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_a8);
        best_bits._4_4_ = *puVar2;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_a8);
    }
    all_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[uStack_90] = best_bits._4_4_;
  }
  local_d0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_c8,&local_d0);
  while( true ) {
    i_1 = (size_t)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c8,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&i_1);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_c8);
    Histogram<704>::Clear(out + *puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_c8);
  }
  for (local_e0 = 0; local_e0 < in_size; local_e0 = local_e0 + 1) {
    Histogram<704>::AddHistogram
              (out + all_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage[local_e0],in + local_e0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return;
}

Assistant:

void HistogramRemap(const HistogramType* in, size_t in_size,
                    HistogramType* out, uint32_t* symbols) {
  // Uniquify the list of symbols.
  std::vector<uint32_t> all_symbols(symbols, symbols + in_size);
  std::sort(all_symbols.begin(), all_symbols.end());
  std::vector<uint32_t>::iterator last =
      std::unique(all_symbols.begin(), all_symbols.end());
  all_symbols.resize(static_cast<size_t>(last - all_symbols.begin()));

  for (size_t i = 0; i < in_size; ++i) {
    uint32_t best_out = i == 0 ? symbols[0] : symbols[i - 1];
    double best_bits = HistogramBitCostDistance(in[i], out[best_out]);
    for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
         k != all_symbols.end(); ++k) {
      const double cur_bits = HistogramBitCostDistance(in[i], out[*k]);
      if (cur_bits < best_bits) {
        best_bits = cur_bits;
        best_out = *k;
      }
    }
    symbols[i] = best_out;
  }


  // Recompute each out based on raw and symbols.
  for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
       k != all_symbols.end(); ++k) {
    out[*k].Clear();
  }
  for (size_t i = 0; i < in_size; ++i) {
    out[symbols[i]].AddHistogram(in[i]);
  }
}